

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O0

int __thiscall deqp::gles2::Functional::ShaderApiTests::init(ShaderApiTests *this,EVP_PKEY_CTX *ctx)

{
  string *__return_storage_ptr__;
  Context *pCVar1;
  ShaderType shaderType_00;
  int iVar2;
  TestCaseGroup *pTVar3;
  CreateShaderCase *pCVar4;
  TestNode *pTVar5;
  CompileShaderCase *pCVar6;
  ShaderSourceReplaceCase *this_00;
  char *pcVar7;
  ShaderSourceSplitCase *this_01;
  char *pcVar8;
  char *local_520;
  char *local_518;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  TestCaseGroup *local_278;
  TestCaseGroup *linkStatusGroup;
  allocator<char> local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  string caseDesc_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  string caseName_1;
  deUint32 flags;
  bool randomNullTerm;
  int iStack_fc;
  bool explicitLengths;
  ShaderType shaderType_1;
  int numSlices;
  int shaderTypeInt_1;
  int caseNdx;
  int stringLengthsInt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  string caseDesc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string caseName;
  ShaderType shaderType;
  int shaderTypeInt;
  TestCaseGroup *shaderSourceGroup;
  TestCaseGroup *compileLinkGroup;
  TestCaseGroup *createDeleteGroup;
  ShaderApiTests *this_local;
  
  pTVar3 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar3,(this->super_TestCaseGroup).m_context,"create_delete","glCreateShader() tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  pCVar4 = (CreateShaderCase *)operator_new(0xa0);
  CreateShaderCase::CreateShaderCase
            (pCVar4,(this->super_TestCaseGroup).m_context,"create_vertex_shader",
             "Create vertex shader object",SHADERTYPE_VERTEX);
  tcu::TestNode::addChild((TestNode *)pTVar3,(TestNode *)pCVar4);
  pCVar4 = (CreateShaderCase *)operator_new(0xa0);
  CreateShaderCase::CreateShaderCase
            (pCVar4,(this->super_TestCaseGroup).m_context,"create_fragment_shader",
             "Create fragment shader object",SHADERTYPE_FRAGMENT);
  tcu::TestNode::addChild((TestNode *)pTVar3,(TestNode *)pCVar4);
  pTVar5 = (TestNode *)operator_new(0xa8);
  DeleteShaderCase::DeleteShaderCase
            ((DeleteShaderCase *)pTVar5,(this->super_TestCaseGroup).m_context,
             "delete_vertex_fragment","Delete vertex shader and fragment shader");
  tcu::TestNode::addChild((TestNode *)pTVar3,pTVar5);
  pTVar3 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar3,(this->super_TestCaseGroup).m_context,"compile_link","Compile and link tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  pCVar6 = (CompileShaderCase *)operator_new(0xa0);
  CompileShaderCase::CompileShaderCase
            (pCVar6,(this->super_TestCaseGroup).m_context,"compile_vertex_shader",
             "Compile vertex shader",SHADERTYPE_VERTEX);
  tcu::TestNode::addChild((TestNode *)pTVar3,(TestNode *)pCVar6);
  pCVar6 = (CompileShaderCase *)operator_new(0xa0);
  CompileShaderCase::CompileShaderCase
            (pCVar6,(this->super_TestCaseGroup).m_context,"compile_fragment_shader",
             "Compile fragment shader",SHADERTYPE_FRAGMENT);
  tcu::TestNode::addChild((TestNode *)pTVar3,(TestNode *)pCVar6);
  pTVar5 = (TestNode *)operator_new(0xa8);
  LinkVertexFragmentCase::LinkVertexFragmentCase
            ((LinkVertexFragmentCase *)pTVar5,(this->super_TestCaseGroup).m_context,
             "link_vertex_fragment","Link vertex and fragment shaders");
  tcu::TestNode::addChild((TestNode *)pTVar3,pTVar5);
  pTVar3 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar3,(this->super_TestCaseGroup).m_context,"shader_source","glShaderSource() tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  for (caseName.field_2._12_4_ = 0; (int)caseName.field_2._12_4_ < 2;
      caseName.field_2._12_4_ = caseName.field_2._12_4_ + 1) {
    caseName.field_2._8_4_ = ZEXT14(caseName.field_2._12_4_ == 1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"replace_source",
               (allocator<char> *)(caseDesc.field_2._M_local_buf + 0xf));
    pcVar8 = "_vertex";
    if (caseName.field_2._8_4_ == 1) {
      pcVar8 = "_fragment";
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   &local_80,pcVar8);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)(caseDesc.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stringLengthsInt,"Replace source code of ",
               (allocator<char> *)((long)&caseNdx + 3));
    pcVar8 = "Unexpected vertex";
    if (caseName.field_2._8_4_ == 1) {
      pcVar8 = "Vertex and fragment";
    }
    std::operator+(&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stringLengthsInt,pcVar8 + 0xb);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   &local_c8," shader.");
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&stringLengthsInt);
    std::allocator<char>::~allocator((allocator<char> *)((long)&caseNdx + 3));
    this_00 = (ShaderSourceReplaceCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar8 = (char *)std::__cxx11::string::c_str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    ShaderSourceReplaceCase::ShaderSourceReplaceCase
              (this_00,pCVar1,pcVar8,pcVar7,caseName.field_2._8_4_);
    tcu::TestNode::addChild((TestNode *)pTVar3,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)local_60);
  }
  for (shaderTypeInt_1 = 0; shaderTypeInt_1 < 3; shaderTypeInt_1 = shaderTypeInt_1 + 1) {
    for (numSlices = 1; numSlices < 4; numSlices = numSlices + 1) {
      for (shaderType_1 = SHADERTYPE_VERTEX; (int)shaderType_1 < 2;
          shaderType_1 = shaderType_1 + SHADERTYPE_FRAGMENT) {
        iStack_fc = 1 << ((byte)numSlices & 0x1f);
        shaderType_00 = (ShaderType)(shaderType_1 == SHADERTYPE_FRAGMENT);
        caseName_1.field_2._M_local_buf[0xf] = shaderTypeInt_1 != 0;
        caseName_1.field_2._M_local_buf[0xe] = shaderTypeInt_1 == 2;
        caseName_1.field_2._8_4_ =
             (uint)(byte)caseName_1.field_2._M_local_buf[0xf] +
             (uint)(byte)caseName_1.field_2._M_local_buf[0xe] * 2;
        __return_storage_ptr__ = (string *)((long)&caseDesc_1.field_2 + 8);
        de::toString<int>(__return_storage_ptr__,&stack0xffffffffffffff04);
        std::operator+(&local_168,"split_source_",__return_storage_ptr__);
        if ((caseName_1.field_2._M_local_buf[0xe] & 1U) == 0) {
          if ((caseName_1.field_2._M_local_buf[0xf] & 1U) == 0) {
            local_520 = "_null_terminated";
          }
          else {
            local_520 = "_specify_lengths";
          }
          local_518 = local_520;
        }
        else {
          local_518 = "_random_negative_length";
        }
        std::operator+(&local_148,&local_168,local_518);
        pcVar8 = "_vertex";
        if (shaderType_00 == SHADERTYPE_FRAGMENT) {
          pcVar8 = "_fragment";
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_128,&local_148,pcVar8);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)(caseDesc_1.field_2._M_local_buf + 8));
        pcVar8 = "Vertex";
        if (shaderType_00 == SHADERTYPE_FRAGMENT) {
          pcVar8 = "Fragment";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,pcVar8,&local_249);
        std::operator+(&local_228,&local_248," shader source split into ");
        de::toString<int>((string *)&linkStatusGroup,&stack0xffffffffffffff04);
        std::operator+(&local_208,&local_228,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &linkStatusGroup);
        std::operator+(&local_1e8,&local_208," pieces");
        pcVar8 = "";
        if ((caseName_1.field_2._M_local_buf[0xf] & 1U) != 0) {
          pcVar8 = ", using explicitly specified string lengths";
        }
        std::operator+(&local_1c8,&local_1e8,pcVar8);
        pcVar8 = "";
        if ((caseName_1.field_2._M_local_buf[0xe] & 1U) != 0) {
          pcVar8 = " with random negative length values";
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,&local_1c8,pcVar8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&linkStatusGroup);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_248);
        std::allocator<char>::~allocator(&local_249);
        this_01 = (ShaderSourceSplitCase *)operator_new(0xb8);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar8 = (char *)std::__cxx11::string::c_str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        ShaderSourceSplitCase::ShaderSourceSplitCase
                  (this_01,pCVar1,pcVar8,pcVar7,shaderType_00,iStack_fc,caseName_1.field_2._8_4_);
        tcu::TestNode::addChild((TestNode *)pTVar3,(TestNode *)this_01);
        std::__cxx11::string::~string((string *)local_1a8);
        std::__cxx11::string::~string((string *)local_128);
      }
    }
  }
  pTVar3 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar3,(this->super_TestCaseGroup).m_context,"program_state",
             "Program state persistence tests");
  local_278 = pTVar3;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  pTVar3 = local_278;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"detach_shader",&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"detach shader",&local_2c1);
  Functional::anon_unknown_0::
  addProgramStateCase<deqp::gles2::Functional::ProgramStateDetachShaderCase>
            (pTVar3,pCVar1,&local_298,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  pTVar3 = local_278;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"reattach_shader",&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"reattach shader",&local_311);
  Functional::anon_unknown_0::
  addProgramStateCase<deqp::gles2::Functional::ProgramStateReattachShaderCase>
            (pTVar3,pCVar1,&local_2e8,&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  pTVar3 = local_278;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"delete_shader",&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"delete shader",&local_361);
  Functional::anon_unknown_0::
  addProgramStateCase<deqp::gles2::Functional::ProgramStateDeleteShaderCase>
            (pTVar3,pCVar1,&local_338,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  pTVar3 = local_278;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"replace_shader",&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,"replace shader object",&local_3b1);
  Functional::anon_unknown_0::
  addProgramStateCase<deqp::gles2::Functional::ProgramStateReplaceShaderCase>
            (pTVar3,pCVar1,&local_388,&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  pTVar3 = local_278;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,"recompile_shader",&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,"recompile shader",&local_401);
  Functional::anon_unknown_0::
  addProgramStateCase<deqp::gles2::Functional::ProgramStateRecompileShaderCase>
            (pTVar3,pCVar1,&local_3d8,&local_400);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  pTVar3 = local_278;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,"replace_source",&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"replace shader source",&local_451);
  Functional::anon_unknown_0::
  addProgramStateCase<deqp::gles2::Functional::ProgramStateReplaceSourceCase>
            (pTVar3,pCVar1,&local_428,&local_450);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  std::__cxx11::string::~string((string *)&local_428);
  iVar2 = std::allocator<char>::~allocator(&local_429);
  return iVar2;
}

Assistant:

void ShaderApiTests::init (void)
{
	// create and delete shaders
	{
		TestCaseGroup* createDeleteGroup = new TestCaseGroup(m_context, "create_delete", "glCreateShader() tests");
		addChild(createDeleteGroup);

		createDeleteGroup->addChild(new CreateShaderCase(m_context,	"create_vertex_shader",		"Create vertex shader object",		glu::SHADERTYPE_VERTEX));
		createDeleteGroup->addChild(new CreateShaderCase(m_context,	"create_fragment_shader",	"Create fragment shader object",	glu::SHADERTYPE_FRAGMENT));

		createDeleteGroup->addChild(new DeleteShaderCase(m_context,	"delete_vertex_fragment",	"Delete vertex shader and fragment shader"));
	}

	// compile and link
	{
		TestCaseGroup* compileLinkGroup = new TestCaseGroup(m_context, "compile_link", "Compile and link tests");
		addChild(compileLinkGroup);

		compileLinkGroup->addChild(new CompileShaderCase(m_context,	"compile_vertex_shader",	"Compile vertex shader",	glu::SHADERTYPE_VERTEX));
		compileLinkGroup->addChild(new CompileShaderCase(m_context,	"compile_fragment_shader",	"Compile fragment shader",	glu::SHADERTYPE_FRAGMENT));

		compileLinkGroup->addChild(new LinkVertexFragmentCase(m_context,	"link_vertex_fragment",	"Link vertex and fragment shaders"));
	}

	// shader source
	{
		TestCaseGroup* shaderSourceGroup = new TestCaseGroup(m_context, "shader_source", "glShaderSource() tests");
		addChild(shaderSourceGroup);

		for (int shaderTypeInt = 0; shaderTypeInt < 2; shaderTypeInt++)
		{
			const glu::ShaderType	shaderType	= (shaderTypeInt == 1) ? glu::SHADERTYPE_FRAGMENT : glu::SHADERTYPE_VERTEX;

			const std::string		caseName	= std::string("replace_source") + ((shaderType == glu::SHADERTYPE_FRAGMENT) ? "_fragment" : "_vertex");
			const std::string		caseDesc	= std::string("Replace source code of ") + ((shaderType == glu::SHADERTYPE_FRAGMENT) ? "fragment" : "vertex") + " shader.";

			shaderSourceGroup->addChild(new ShaderSourceReplaceCase(m_context, caseName.c_str(), caseDesc.c_str(), shaderType));
		}

		for (int stringLengthsInt	= 0; stringLengthsInt < 3; stringLengthsInt++)
		for (int caseNdx = 1; caseNdx <= 3; caseNdx++)
		for (int shaderTypeInt = 0; shaderTypeInt < 2; shaderTypeInt++)
		{
			const int				numSlices		= 1 << caseNdx;
			const glu::ShaderType	shaderType		= (shaderTypeInt == 1) ? glu::SHADERTYPE_FRAGMENT : glu::SHADERTYPE_VERTEX;

			const bool				explicitLengths	= (stringLengthsInt != 0);
			const bool				randomNullTerm	= (stringLengthsInt == 2);

			const deUint32			flags			= (explicitLengths	? CASE_EXPLICIT_SOURCE_LENGTHS	: 0)
													| (randomNullTerm	? CASE_RANDOM_NULL_TERMINATED	: 0);

			const std::string		caseName		= "split_source_"
													+ de::toString(numSlices)
													+ (randomNullTerm ? "_random_negative_length" : (explicitLengths ? "_specify_lengths" : "_null_terminated"))
													+ ((shaderType == glu::SHADERTYPE_FRAGMENT) ? "_fragment" : "_vertex");

			const std::string		caseDesc		= std::string((shaderType == glu::SHADERTYPE_FRAGMENT) ? "Fragment" : "Vertex")
													+ " shader source split into "
													+ de::toString(numSlices)
													+ " pieces"
													+ (explicitLengths ? ", using explicitly specified string lengths" : "")
													+ (randomNullTerm ? " with random negative length values" : "");

			shaderSourceGroup->addChild(new ShaderSourceSplitCase(m_context, caseName.c_str(), caseDesc.c_str(), shaderType, numSlices, flags));
		}
	}

	// link status and infolog
	{
		TestCaseGroup* linkStatusGroup = new TestCaseGroup(m_context, "program_state", "Program state persistence tests");
		addChild(linkStatusGroup);

		addProgramStateCase<ProgramStateDetachShaderCase>		(linkStatusGroup,	m_context,	"detach_shader",	"detach shader");
		addProgramStateCase<ProgramStateReattachShaderCase>		(linkStatusGroup,	m_context,	"reattach_shader",	"reattach shader");
		addProgramStateCase<ProgramStateDeleteShaderCase>		(linkStatusGroup,	m_context,	"delete_shader",	"delete shader");
		addProgramStateCase<ProgramStateReplaceShaderCase>		(linkStatusGroup,	m_context,	"replace_shader",	"replace shader object");
		addProgramStateCase<ProgramStateRecompileShaderCase>	(linkStatusGroup,	m_context,	"recompile_shader",	"recompile shader");
		addProgramStateCase<ProgramStateReplaceSourceCase>		(linkStatusGroup,	m_context,	"replace_source",	"replace shader source");
	}
}